

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_Single_Test::TestBody
          (MessageDifferencerTest_IgnoreField_Single_Test *this)

{
  FieldDescriptor *field;
  TestField msg1;
  TestField msg2;
  MessageDifferencer differencer;
  Message *local_290;
  string *local_288;
  Message local_280;
  undefined1 local_270 [88];
  undefined1 local_218 [88];
  MessageDifferencer local_1c0;
  
  proto2_unittest::TestField::TestField((TestField *)local_270,(Arena *)0x0);
  proto2_unittest::TestField::TestField((TestField *)local_218,(Arena *)0x0);
  local_270._72_4_ = 3;
  local_270[0x10] = local_270[0x10] | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)(local_270 + 0x18),1);
  local_218._72_4_ = 5;
  local_218[0x10] = local_218[0x10] | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)(local_218 + 0x18),1);
  util::MessageDifferencer::MessageDifferencer(&local_1c0);
  local_290 = &local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"c","");
  field = GetFieldDescriptor((anon_unknown_0 *)local_270,local_290,local_288);
  util::MessageDifferencer::IgnoreField(&local_1c0,field);
  if (local_290 != &local_280) {
    operator_delete(local_290,(long)local_280.super_MessageLite._vptr_MessageLite + 1);
  }
  ExpectEqualsWithDifferencer(&local_1c0,(Message *)local_270,(Message *)local_218);
  util::MessageDifferencer::~MessageDifferencer(&local_1c0);
  proto2_unittest::TestField::~TestField((TestField *)local_218);
  proto2_unittest::TestField::~TestField((TestField *)local_270);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_Single) {
  proto2_unittest::TestField msg1;
  proto2_unittest::TestField msg2;

  msg1.set_c(3);
  msg1.add_rc(1);

  msg2.set_c(5);
  msg2.add_rc(1);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(GetFieldDescriptor(msg1, "c"));

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}